

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTree.cpp
# Opt level: O3

string * __thiscall ASTree::yield_abi_cxx11_(string *__return_storage_ptr__,ASTree *this)

{
  pointer ppAVar1;
  pointer pcVar2;
  pointer ppAVar3;
  string local_50;
  
  ppAVar3 = (this->subtrees).super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppAVar1 = (this->subtrees).super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppAVar1 == ppAVar3) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (this->root)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (this->root)._M_string_length);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    do {
      yield_abi_cxx11_(&local_50,*ppAVar3);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      ppAVar3 = ppAVar3 + 1;
    } while (ppAVar3 != ppAVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ASTree::yield() {
    if(subtrees.size() == 0){
        // terminal
        return root;
    }
    std::string yield;
    for(auto subtree: subtrees){
        yield += subtree->yield();
    }
    return yield;
}